

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemWrapper.cpp
# Opt level: O1

void __thiscall ItemWrapper::setItemName(ItemWrapper *this,string item)

{
  string local_30;
  
  Item::getName_abi_cxx11_(&local_30,&this->classItem);
  std::__cxx11::string::operator=((string *)&this->itemName,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ItemWrapper::setItemName(std::string item) {
    itemName = classItem.getName();
}